

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::doctypePI(AbstractDOMParser *this,XMLCh *target,XMLCh *data)

{
  bool bVar1;
  
  bVar1 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar1) {
    XMLBuffer::append(this->fInternalSubset,L'<');
    XMLBuffer::append(this->fInternalSubset,L'?');
    XMLBuffer::append(this->fInternalSubset,target);
    XMLBuffer::append(this->fInternalSubset,L' ');
    XMLBuffer::append(this->fInternalSubset,data);
    XMLBuffer::append(this->fInternalSubset,L'?');
    XMLBuffer::append(this->fInternalSubset,L'>');
    return;
  }
  return;
}

Assistant:

void AbstractDOMParser::doctypePI
(
    const   XMLCh* const    target
    , const XMLCh* const    data
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        //add these chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chQuestion);
        fInternalSubset.append(target);
        fInternalSubset.append(chSpace);
        fInternalSubset.append(data);
        fInternalSubset.append(chQuestion);
        fInternalSubset.append(chCloseAngle);
    }
}